

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                 (EnumDescriptorProto_EnumReservedRange *value)

{
  size_t sVar1;
  EnumDescriptorProto_EnumReservedRange *in_stack_00000008;
  
  EnumDescriptorProto_EnumReservedRange::ByteSizeLong(in_stack_00000008);
  sVar1 = LengthDelimitedSize((size_t)value);
  return sVar1;
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}